

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O3

void capnp::compiler::anon_unknown_0::checkExampleField
               (Reader reader,Field field,uint sharedOrdinalCount)

{
  Reader type;
  Reader reader_00;
  Field field_00;
  uint ordinal;
  uint sharedOrdinalCount_00;
  Reader *this;
  SegmentReader *local_148;
  CapTableReader *pCStack_140;
  ReaderFor<DynamicStruct> local_130;
  StructReader local_f8;
  SegmentReader *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined4 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff54 [60];
  
  local_148 = field.proto._reader.segment;
  pCStack_140 = field.proto._reader.capTable;
  if (0x4f < field.proto._reader.dataSize) {
    if (*(short *)((long)field.proto._reader.data + 8) == 1) {
      DynamicStruct::Reader::get((Reader *)&local_c8,&reader,field);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&local_130,(Reader *)&local_c8);
      reader_00.reader.segment = local_130.reader.segment;
      reader_00.schema.super_Schema.raw = local_130.schema.super_Schema.raw;
      reader_00.reader.capTable = local_130.reader.capTable;
      reader_00.reader.data = local_130.reader.data;
      reader_00.reader.pointers = local_130.reader.pointers;
      reader_00.reader.dataSize = local_130.reader.dataSize;
      reader_00.reader.pointerCount = local_130.reader.pointerCount;
      reader_00.reader._38_2_ = local_130.reader._38_2_;
      reader_00.reader.nestingLimit = local_130.reader.nestingLimit;
      reader_00.reader._44_4_ = local_130.reader._44_4_;
      checkExampleStruct(reader_00,sharedOrdinalCount);
      this = (Reader *)&local_c8;
      goto LAB_0015155d;
    }
    if (*(short *)((long)field.proto._reader.data + 8) != 0) {
      return;
    }
  }
  field_00._4_60_ = in_stack_ffffffffffffff54;
  field_00.parent.super_Schema.raw._0_4_ = in_stack_ffffffffffffff50;
  ordinal = getOrdinal(field_00);
  if (sharedOrdinalCount <= ordinal) {
    return;
  }
  DynamicStruct::Reader::get((Reader *)&stack0xffffffffffffff88,&reader,field);
  local_b8 = field.proto._reader.pointers + 2;
  if (field.proto._reader.pointerCount < 3) {
    local_148 = (SegmentReader *)0x0;
    pCStack_140 = (CapTableReader *)0x0;
    local_b8 = (WirePointer *)0x0;
  }
  local_c8 = local_148;
  uStack_c0 = pCStack_140;
  _::PointerReader::getStruct(&local_f8,(PointerReader *)&local_c8,(word *)0x0);
  type._reader.capTable = local_f8.capTable;
  type._reader.segment = local_f8.segment;
  type._reader.data = local_f8.data;
  type._reader.pointers = local_f8.pointers;
  type._reader.dataSize = local_f8.dataSize;
  type._reader.pointerCount = local_f8.pointerCount;
  type._reader._38_2_ = local_f8._38_2_;
  type._reader.nestingLimit = local_f8.nestingLimit;
  type._reader._44_4_ = local_f8._44_4_;
  checkExampleValue((Reader *)&stack0xffffffffffffff88,ordinal,type,sharedOrdinalCount_00);
  this = (Reader *)&stack0xffffffffffffff88;
LAB_0015155d:
  DynamicValue::Reader::~Reader(this);
  return;
}

Assistant:

void checkExampleField(DynamicStruct::Reader reader, StructSchema::Field field,
                       uint sharedOrdinalCount) {
  auto fieldProto = field.getProto();
  switch (fieldProto.which()) {
    case schema::Field::SLOT: {
      uint ordinal = getOrdinal(field);
      if (ordinal < sharedOrdinalCount) {
        checkExampleValue(reader.get(field), ordinal,
                          fieldProto.getSlot().getType(), sharedOrdinalCount);
      }
      break;
    }
    case schema::Field::GROUP:
      checkExampleStruct(reader.get(field).as<DynamicStruct>(), sharedOrdinalCount);
      break;
  }
}